

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::ClassType::serializeTo(ClassType *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppTVar2;
  Expression *__n;
  long lVar3;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write(serializer,10,"isAbstract",(ulong)this->isAbstract);
  ASTSerializer::write(serializer,0xb,"isInterface",(ulong)this->isInterface);
  ASTSerializer::write(serializer,7,"isFinal",(ulong)this->isFinal);
  if (this->firstForward != (ForwardingTypedefSymbol *)0x0) {
    ASTSerializer::write(serializer,7,"forward",(size_t)this->firstForward);
  }
  if (this->genericClass != (GenericClassDefSymbol *)0x0) {
    name._M_str = "genericClass";
    name._M_len = 0xc;
    ASTSerializer::writeLink(serializer,name,&this->genericClass->super_Symbol);
  }
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&this->super_Scope);
  }
  if (this->baseClass != (Type *)0x0) {
    ASTSerializer::write(serializer,9,"baseClass",(size_t)this->baseClass);
  }
  __n = getBaseConstructorCall(this);
  if (__n != (Expression *)0x0) {
    ASTSerializer::write(serializer,0x13,"baseConstructorCall",(size_t)__n);
  }
  name_00._M_str = "implements";
  name_00._M_len = 10;
  ASTSerializer::startArray(serializer,name_00);
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&this->super_Scope);
  }
  sVar1 = (this->declaredIfaces)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppTVar2 = (this->declaredIfaces)._M_ptr;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Symbol **)((long)ppTVar2 + lVar3),false);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void ClassType::serializeTo(ASTSerializer& serializer) const {
    serializer.write("isAbstract", isAbstract);
    serializer.write("isInterface", isInterface);
    serializer.write("isFinal", isFinal);
    if (firstForward)
        serializer.write("forward", *firstForward);
    if (genericClass)
        serializer.writeLink("genericClass", *genericClass);
    if (auto base = getBaseClass())
        serializer.write("baseClass", *base);
    if (auto expr = getBaseConstructorCall())
        serializer.write("baseConstructorCall", *expr);

    serializer.startArray("implements");
    for (auto type : getDeclaredInterfaces())
        serializer.serialize(*type);
    serializer.endArray();
}